

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFopen.c
# Opt level: O1

void * NFopen(char *file,int mode,void *addr,ProxyRecord *records)

{
  NF_list *pNVar1;
  NF_link_map *pNVar2;
  NF_link_map *pNVar3;
  NF_link_map *pNVar4;
  ulong uVar5;
  void *addr_00;
  NF_list *pNVar6;
  
  uVar5 = (ulong)(uint)mode;
  if (head != (NF_list *)0x0) {
    pNVar4 = NF_map(head,mode,addr);
    pNVar6 = head->next;
    if (pNVar6 != (NF_list *)0x0) {
      addr_00 = (void *)(pNVar4->l_addr + head->len);
      do {
        NF_map(pNVar6,(int)uVar5,addr_00);
        addr_00 = (void *)((long)addr_00 + pNVar6->len);
        pNVar6 = pNVar6->next;
      } while (pNVar6 != (NF_list *)0x0);
    }
    pNVar6 = head;
    head->map->l_prev = (NF_link_map *)0x0;
    while( true ) {
      NFreloc(pNVar6->map,records);
      pNVar1 = pNVar6->next;
      if (pNVar1 == (NF_list *)0x0) break;
      pNVar2 = pNVar1->map;
      pNVar3 = pNVar6->map;
      pNVar3->l_next = pNVar2;
      pNVar2->l_prev = pNVar3;
      pNVar6 = pNVar1;
    }
    pNVar6->map->l_next = (NF_link_map *)0x0;
    pNVar6 = head;
    while (pNVar6 != (NF_list *)0x0) {
      close(pNVar6->fd);
      pNVar1 = pNVar6->next;
      free(pNVar6);
      pNVar6 = pNVar1;
    }
    return pNVar4;
  }
  puts("Fatal error: NFusage not called before NFopen!");
  exit(1);
}

Assistant:

static void NFopen_worker(void *a, const ProxyRecord *records)
{
    struct NFopen_args *args = a;
    const char *file = args->file;
    int mode  = args->mode;
    void *addr = args->addr;

    if(head == NULL)
    {
        printf("Fatal error: NFusage not called before NFopen!\n");
        //maybe directly exit here?
        exit(1);
    }
    /* search and load and map, space is allocated here on heap */
    struct NF_link_map *new = NF_map(head, mode, addr);
    args->new = new;

    /* the mapping of dependencies is now controled by the list, so no need for map_deps */
    struct NF_list *tmp = head->next;
    Elf64_Addr next_addr = (Elf64_Addr) new->l_addr + head->len; //use l_addr instead of addr in case of 0

    while(tmp)
    {
        //add interactive querying for address here
        int tmp_mode;
        //printf("shared library:%s needs an open mode:", tmp->map->l_name);
        //scanf("%d", &tmp_mode);
        //Elf64_Addr tmp_addr = 0x0;
        //NF_map(tmp, tmp_mode, (void *)tmp_addr);
        NF_map(tmp, tmp_mode, (void *) next_addr);
        next_addr += tmp->len;
        
        tmp = tmp->next;
    }

    /* filling in dependency info, like search list */
    //map_deps(new);

    /* relocating */
    /* I don't think a relocation is needed when so access its internal funcs and vars
     * Using l_addr + their offset at ELF will resolve it, because we are dynamically loading
     * we don't even need to know the address of the symbols until a explicit NFsym is called
     * Upon call, NFsym check match the dynamic symbol table, and return an address
     * 
     * But external symbols certainly need relocation, for we don't know the address of other so at runtime
     * The dynamic loader would probably do the job: go through all the link map, find the dependency, and use the base address
     * of the dep as the l_addr of that symbol. In this case the main program may exist as a link map
     * because of the --rdynamic option at linking
     * In this case, we need to traverse the link_map like ld.so, and update the GOT
     * It would make a difference whether the deps are mapped as an NF or not, in which case we check both link(only 2!)
     * 
     * After all, I'm doing a dynamic loading, and don't need the symbols to be all settled when I enter the program
     */
    tmp = head;
    tmp->map->l_prev = NULL;
    while(tmp)
    {
        NFreloc(tmp->map, records);
        if(tmp->next)
        {
            tmp->map->l_next = tmp->next->map;
            tmp->next->map->l_prev = tmp->map;
        }
        else
        {
            tmp->map->l_next = NULL;
        }
        
        tmp = tmp->next;
    }

    /* destroy the list */
    tmp = head;
    struct NF_list *late;
    while (tmp)
    {
        close(tmp ->fd);
        late = tmp;
        tmp = tmp->next;
        free(late);
    }
    
    //NFreloc(new);
}